

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

char __thiscall Assimp::StreamReader<true,_true>::Get<signed_char>(StreamReader<true,_true> *this)

{
  char *pcVar1;
  char cVar2;
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  
  pcVar1 = this->current + 1;
  if (pcVar1 <= this->limit) {
    cVar2 = *this->current;
    this->current = pcVar1;
    return cVar2;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"End of file or stream limit was reached",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }